

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O3

LY_ERR lyb_print_prefix_data(ly_out *out,LY_VALUE_FORMAT format,void *prefix_data,lylyb_ctx *lybctx)

{
  undefined8 *puVar1;
  LY_ERR LVar2;
  long lVar3;
  uint8_t local_3c [4];
  ulong local_38;
  
  if (1 < format - LY_VALUE_JSON) {
    if (format != LY_VALUE_XML) {
      ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c",
             0x29f);
      return LY_EINT;
    }
    if (prefix_data == (void *)0x0) {
      local_3c[0] = '\0';
      local_3c[1] = '\0';
      local_3c[2] = '\0';
      local_3c[3] = '\0';
      LVar2 = lyb_write(out,local_3c,1,lybctx);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    else {
      local_38 = (ulong)*(uint *)((long)prefix_data + 4);
      if (0xff < local_38) {
        ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Maximum supported number of prefixes is %u.",0xff);
        return LY_EINT;
      }
      LVar2 = lyb_write(out,(uint8_t *)&local_38,1,lybctx);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (*(int *)((long)prefix_data + 4) != 0) {
        lVar3 = 0;
        do {
          puVar1 = *(undefined8 **)(*(long *)((long)prefix_data + 8) + lVar3 * 8);
          LVar2 = lyb_write_string((char *)*puVar1,0,'\x02',out,lybctx);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          LVar2 = lyb_write_string((char *)puVar1[1],0,'\x02',out,lybctx);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          lVar3 = lVar3 + 1;
        } while ((uint)lVar3 < *(uint *)((long)prefix_data + 4));
      }
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_print_prefix_data(struct ly_out *out, LY_VALUE_FORMAT format, const void *prefix_data, struct lylyb_ctx *lybctx)
{
    const struct ly_set *set;
    const struct lyxml_ns *ns;
    uint32_t i;

    switch (format) {
    case LY_VALUE_XML:
        set = prefix_data;
        if (!set) {
            /* no prefix data */
            i = 0;
            LY_CHECK_RET(lyb_write(out, (uint8_t *)&i, 1, lybctx));
            break;
        }
        if (set->count > UINT8_MAX) {
            LOGERR(lybctx->ctx, LY_EINT, "Maximum supported number of prefixes is %u.", UINT8_MAX);
            return LY_EINT;
        }

        /* write number of prefixes on 1 byte */
        LY_CHECK_RET(lyb_write_number(set->count, 1, out, lybctx));

        /* write all the prefixes */
        for (i = 0; i < set->count; ++i) {
            ns = set->objs[i];

            /* prefix */
            LY_CHECK_RET(lyb_write_string(ns->prefix, 0, sizeof(uint16_t), out, lybctx));

            /* namespace */
            LY_CHECK_RET(lyb_write_string(ns->uri, 0, sizeof(uint16_t), out, lybctx));
        }
        break;
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        /* nothing to print */
        break;
    default:
        LOGINT_RET(lybctx->ctx);
    }

    return LY_SUCCESS;
}